

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console_Command.cpp
# Opt level: O2

ConsoleCommand * getConsoleCommand(string_view trigger)

{
  pointer ppCVar1;
  char cVar2;
  ConsoleCommand **command;
  pointer ppCVar3;
  
  ppCVar1 = g_consoleCommands.
            super__Vector_base<ConsoleCommand_*,_std::allocator<ConsoleCommand_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar3 = g_consoleCommands.
            super__Vector_base<ConsoleCommand_*,_std::allocator<ConsoleCommand_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppCVar3 == ppCVar1) {
      return (ConsoleCommand *)0x0;
    }
    cVar2 = Jupiter::Command::matches(*ppCVar3,trigger._M_len,trigger._M_str);
    if (cVar2 != '\0') break;
    ppCVar3 = ppCVar3 + 1;
  }
  return *ppCVar3;
}

Assistant:

ConsoleCommand* getConsoleCommand(std::string_view trigger) {
	for (const auto& command : consoleCommands) {
		if (command->matches(trigger)) {
			return command;
		}
	}

	return nullptr;
}